

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O2

void __thiscall
vkt::sr::anon_unknown_0::ShaderIndexingCase::ShaderIndexingCase
          (ShaderIndexingCase *this,TestContext *testCtx,string *name,string *description,
          bool isVertexCase,ShaderEvalFunc evalFunc,string *vertShaderSource,
          string *fragShaderSource,DataType varType,bool usesArray)

{
  UniformSetup *this_00;
  
  this_00 = (UniformSetup *)operator_new(0x18);
  UniformSetup::UniformSetup(this_00);
  this_00->_vptr_UniformSetup = (_func_int **)&PTR__UniformSetup_00bd1d40;
  *(DataType *)&this_00[1]._vptr_UniformSetup = varType;
  *(bool *)((long)&this_00[1]._vptr_UniformSetup + 4) = usesArray;
  ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,name,description,isVertexCase,evalFunc,this_00,
             (AttributeSetupFunc)0x0);
  (this->super_ShaderRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderRenderCase_00bd1ce0;
  std::__cxx11::string::_M_assign((string *)&(this->super_ShaderRenderCase).m_vertShaderSource);
  std::__cxx11::string::_M_assign((string *)&(this->super_ShaderRenderCase).m_fragShaderSource);
  return;
}

Assistant:

ShaderIndexingCase::ShaderIndexingCase (tcu::TestContext&			testCtx,
										const std::string&			name,
										const std::string&			description,
										const bool					isVertexCase,
										const ShaderEvalFunc		evalFunc,
										const std::string&			vertShaderSource,
										const std::string&			fragShaderSource,
										const DataType				varType,
										const bool					usesArray)
	: ShaderRenderCase(testCtx, name, description, isVertexCase, evalFunc, new IndexingTestUniformSetup(varType, usesArray), DE_NULL)
{
	m_vertShaderSource	= vertShaderSource;
	m_fragShaderSource	= fragShaderSource;
}